

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceTree.h
# Opt level: O0

void __thiscall Parfait::DistanceTree::DistanceTree(DistanceTree *this,Extent<double> *e)

{
  double dVar1;
  double *pdVar2;
  function<bool_(const_std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&)>
  local_118;
  anon_class_8_1_8991fb9c local_f8;
  anon_class_8_1_8991fb9c should_split;
  Point<double> local_d8;
  Extent<double> local_c0;
  undefined1 local_90 [8];
  Point<double> offset;
  double local_70;
  double local_68;
  double longest_edge;
  Point<double> local_48;
  undefined1 local_30 [8];
  Point<double> center;
  Extent<double> *e_local;
  DistanceTree *this_local;
  
  center.pos._M_elems[2] = (double)e;
  Octree<Parfait::Facet>::Octree(&this->super_Octree<Parfait::Facet>);
  this->max_objects_per_voxel = 0x14;
  Point<double>::operator+
            (&local_48,(Point<double> *)((long)center.pos._M_elems[2] + 0x18),
             (Point<double> *)center.pos._M_elems[2]);
  longest_edge = 0.5;
  Point<double>::operator*((Point<double> *)local_30,&local_48,&longest_edge);
  pdVar2 = Point<double>::operator[]((Point<double> *)((long)center.pos._M_elems[2] + 0x18),0);
  dVar1 = *pdVar2;
  pdVar2 = Point<double>::operator[]((Point<double> *)center.pos._M_elems[2],0);
  local_68 = dVar1 - *pdVar2;
  pdVar2 = Point<double>::operator[]((Point<double> *)((long)center.pos._M_elems[2] + 0x18),1);
  dVar1 = *pdVar2;
  pdVar2 = Point<double>::operator[]((Point<double> *)center.pos._M_elems[2],1);
  local_70 = dVar1 - *pdVar2;
  pdVar2 = std::max<double>(&local_68,&local_70);
  local_68 = *pdVar2;
  pdVar2 = Point<double>::operator[]((Point<double> *)((long)center.pos._M_elems[2] + 0x18),2);
  dVar1 = *pdVar2;
  pdVar2 = Point<double>::operator[]((Point<double> *)center.pos._M_elems[2],2);
  offset.pos._M_elems[2] = dVar1 - *pdVar2;
  pdVar2 = std::max<double>(&local_68,offset.pos._M_elems + 2);
  local_68 = *pdVar2 * 0.5;
  Point<double>::Point((Point<double> *)local_90,local_68,local_68,local_68);
  Point<double>::operator-(&local_d8,(Point<double> *)local_30,(Point<double> *)local_90);
  Point<double>::operator+
            ((Point<double> *)&should_split,(Point<double> *)local_30,(Point<double> *)local_90);
  Extent<double>::Extent(&local_c0,&local_d8,(Point<double> *)&should_split);
  Octree<Parfait::Facet>::setRootExtent(&this->super_Octree<Parfait::Facet>,&local_c0);
  local_f8.this = this;
  std::function<bool(std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>const&)>::
  function<Parfait::DistanceTree::DistanceTree(Parfait::Extent<double>const&)::_lambda(std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>const&)_1_&,void>
            ((function<bool(std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>const&)> *)
             &local_118,&local_f8);
  Octree<Parfait::Facet>::setShouldSplit(&this->super_Octree<Parfait::Facet>,&local_118);
  std::function<bool_(const_std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&)>::
  ~function(&local_118);
  return;
}

Assistant:

inline DistanceTree(const Parfait::Extent<double>& e) {
          auto center = (e.hi + e.lo)*0.5;
          double longest_edge = e.hi[0] - e.lo[0];
          longest_edge = std::max(longest_edge, e.hi[1] - e.lo[1]);
          longest_edge = std::max(longest_edge, e.hi[2] - e.lo[2]);
          longest_edge *= 0.5;
          Parfait::Point<double> offset = {longest_edge, longest_edge, longest_edge};
          setRootExtent({center - offset, center + offset});
          auto should_split = [this](const std::vector<Parfait::Facet*>& objects){
              return objects.size() > max_objects_per_voxel;
          };
          setShouldSplit(should_split);
      }